

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

dtl_json_readerData_t * dtl_json_readerData_new(void)

{
  dtl_json_readerData_t *self_00;
  dtl_json_readerData_t *self;
  
  self_00 = (dtl_json_readerData_t *)malloc(0x30);
  if (self_00 != (dtl_json_readerData_t *)0x0) {
    dtl_json_readerData_create(self_00);
  }
  return self_00;
}

Assistant:

static dtl_json_readerData_t* dtl_json_readerData_new(void)
{
   dtl_json_readerData_t *self = (dtl_json_readerData_t*) malloc(sizeof(dtl_json_readerData_t));
   if (self != 0)
   {
      dtl_json_readerData_create(self);
   }
   return self;
}